

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fastcgi_api.cpp
# Opt level: O0

unique_ptr<cppcms::impl::cgi::acceptor,_std::default_delete<cppcms::impl::cgi::acceptor>_>
cppcms::impl::cgi::fastcgi_api_tcp_socket_factory(service *srv,string *ip,int port,int backlog)

{
  undefined4 in_ECX;
  string *in_RDX;
  tuple<cppcms::impl::cgi::acceptor_*,_std::default_delete<cppcms::impl::cgi::acceptor>_> in_RDI;
  undefined4 in_R8D;
  unique_ptr<cppcms::impl::cgi::acceptor,_std::default_delete<cppcms::impl::cgi::acceptor>_> *a;
  pointer in_stack_ffffffffffffff78;
  _Head_base<0UL,_cppcms::impl::cgi::acceptor_*,_false> this;
  string local_48 [16];
  int in_stack_ffffffffffffffc8;
  int in_stack_ffffffffffffffcc;
  string *in_stack_ffffffffffffffd0;
  undefined7 in_stack_ffffffffffffffd8;
  undefined1 uVar1;
  
  uVar1 = 0;
  this._M_head_impl =
       (acceptor *)
       in_RDI.
       super__Tuple_impl<0UL,_cppcms::impl::cgi::acceptor_*,_std::default_delete<cppcms::impl::cgi::acceptor>_>
       .super__Head_base<0UL,_cppcms::impl::cgi::acceptor_*,_false>._M_head_impl;
  operator_new(0x68);
  std::__cxx11::string::string(local_48,in_RDX);
  socket_acceptor<cppcms::impl::cgi::fastcgi,_cppcms::impl::cgi::server_api_factory<cppcms::impl::cgi::fastcgi>_>
  ::socket_acceptor((socket_acceptor<cppcms::impl::cgi::fastcgi,_cppcms::impl::cgi::server_api_factory<cppcms::impl::cgi::fastcgi>_>
                     *)CONCAT44(in_ECX,in_R8D),(service *)CONCAT17(uVar1,in_stack_ffffffffffffffd8),
                    in_stack_ffffffffffffffd0,in_stack_ffffffffffffffcc,in_stack_ffffffffffffffc8);
  std::unique_ptr<cppcms::impl::cgi::acceptor,std::default_delete<cppcms::impl::cgi::acceptor>>::
  unique_ptr<std::default_delete<cppcms::impl::cgi::acceptor>,void>
            ((unique_ptr<cppcms::impl::cgi::acceptor,_std::default_delete<cppcms::impl::cgi::acceptor>_>
              *)this._M_head_impl,in_stack_ffffffffffffff78);
  std::__cxx11::string::~string(local_48);
  return (__uniq_ptr_data<cppcms::impl::cgi::acceptor,_std::default_delete<cppcms::impl::cgi::acceptor>,_true,_true>
          )(__uniq_ptr_data<cppcms::impl::cgi::acceptor,_std::default_delete<cppcms::impl::cgi::acceptor>,_true,_true>
            )in_RDI.
             super__Tuple_impl<0UL,_cppcms::impl::cgi::acceptor_*,_std::default_delete<cppcms::impl::cgi::acceptor>_>
             .super__Head_base<0UL,_cppcms::impl::cgi::acceptor_*,_false>._M_head_impl;
}

Assistant:

std::unique_ptr<acceptor> fastcgi_api_tcp_socket_factory(cppcms::service &srv,std::string ip,int port,int backlog)
	{
		std::unique_ptr<acceptor> a(new socket_acceptor<fastcgi>(srv,ip,port,backlog));
		return a;
	}